

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  EnumValueDescriptor *this_00;
  Printer *pPVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  EnumValueDescriptor *in_RDX;
  EnumValueDescriptor *extraout_RDX;
  int key;
  long lVar4;
  pointer ppEVar5;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view input_for_decode;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view desired_output;
  allocator<char> local_69f;
  allocator<char> local_69e;
  allocator<char> local_69d;
  allocator<char> local_69c;
  allocator<char> local_69b;
  allocator<char> local_69a;
  allocator<char> local_699;
  _Any_data local_698;
  code *local_688;
  code *pcStack_680;
  EnumGenerator *local_678;
  Printer *printer_local;
  TextFormatDecodeData text_format_decode_data;
  undefined1 *local_650;
  undefined8 local_648;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 *local_630;
  undefined8 local_628;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5e0 [16];
  pointer local_5d0;
  string text_blob;
  char *local_5a8;
  string local_5a0;
  char *local_580;
  string local_578;
  string local_558;
  string short_name;
  variant<std::__cxx11::string,std::function<bool()>> local_460 [32];
  char local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  variant<std::__cxx11::string,std::function<bool()>> local_3a8 [32];
  char local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  _Var3._M_p = (pointer)&text_format_decode_data;
  text_format_decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text_blob._M_dataplus._M_p = (pointer)&text_blob.field_2;
  text_blob._M_string_length = 0;
  text_format_decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  text_format_decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text_blob.field_2._M_local_buf[0] = '\0';
  local_5d0 = (this->all_values_).
              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  key = 0;
  local_678 = this;
  printer_local = printer;
  for (ppEVar5 = (this->all_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar1 = printer_local,
      ppEVar5 != local_5d0; ppEVar5 = ppEVar5 + 1) {
    this_00 = *ppEVar5;
    EnumValueShortName_abi_cxx11_(&short_name,(objectivec *)this_00,in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_698,
                   &short_name,'\0');
    std::__cxx11::string::append((string *)&text_blob);
    std::__cxx11::string::~string((string *)local_698._M_pod_data);
    name._M_str = _Var3._M_p;
    name._M_len = (size_t)short_name._M_dataplus._M_p;
    UnCamelCaseEnumShortName_abi_cxx11_
              ((string *)&local_698,(objectivec *)short_name._M_string_length,name);
    _Var3._M_p = (this_00->all_names_->_M_dataplus)._M_p;
    __y._M_str = _Var3._M_p;
    __y._M_len = this_00->all_names_->_M_string_length;
    __x._M_str = (char *)local_698._M_unused._0_8_;
    __x._M_len = local_698._8_8_;
    bVar2 = std::operator!=(__x,__y);
    std::__cxx11::string::~string((string *)local_698._M_pod_data);
    if (bVar2) {
      input_for_decode._M_str = short_name._M_dataplus._M_p;
      input_for_decode._M_len = short_name._M_string_length;
      desired_output._M_str = (this_00->all_names_->_M_dataplus)._M_p;
      desired_output._M_len = this_00->all_names_->_M_string_length;
      _Var3 = short_name._M_dataplus;
      TextFormatDecodeData::AddString(&text_format_decode_data,key,input_for_decode,desired_output);
    }
    std::__cxx11::string::~string((string *)&short_name);
    key = key + 1;
    in_RDX = extraout_RDX;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"name",&local_699);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            ((Sub *)&short_name,&local_558,&local_678->name_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"values_name_blob",&local_69a);
  local_5f0 = local_5e0;
  local_5e8 = 0;
  local_5e0[0] = 0;
  local_688 = (code *)0x0;
  pcStack_680 = (code *)0x0;
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_698._M_unused._M_object = operator_new(0x18);
  *(string **)local_698._M_unused._0_8_ = &text_blob;
  *(Printer ***)((long)local_698._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_698._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_680 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_460,(function<bool_()> *)&local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_698);
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  if (local_440 == '\x01') {
    std::__cxx11::string::assign((char *)&local_438);
  }
  local_3d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"values",&local_69b);
  local_3c8 = local_3b8;
  if (local_610 == local_600) {
    uStack_3b0 = uStack_5f8;
  }
  else {
    local_3c8 = local_610;
  }
  local_3c0 = local_608;
  local_608 = 0;
  local_600[0] = 0;
  local_688 = (code *)0x0;
  pcStack_680 = (code *)0x0;
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_610 = local_600;
  local_698._M_unused._M_object = operator_new(0x18);
  *(EnumGenerator **)local_698._M_unused._0_8_ = local_678;
  *(Printer ***)((long)local_698._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_698._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_680 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_3a8,(function<bool_()> *)&local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_698);
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  if (local_388 == '\x01') {
    std::__cxx11::string::assign((char *)&local_380);
  }
  local_318 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"maybe_extra_text_format_decl",&local_69c);
  local_310 = local_300;
  if (local_630 == local_620) {
    uStack_2f8 = uStack_618;
  }
  else {
    local_310 = local_630;
  }
  local_308 = local_628;
  local_628 = 0;
  local_620[0] = 0;
  local_688 = (code *)0x0;
  pcStack_680 = (code *)0x0;
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_630 = local_620;
  local_698._M_unused._M_object = operator_new(0x18);
  *(TextFormatDecodeData **)local_698._M_unused._0_8_ = &text_format_decode_data;
  *(Printer ***)((long)local_698._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_698._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_680 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_2f0,(function<bool_()> *)&local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_698);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"maybe_extraTextFormatInfo",&local_69d);
  local_580 = "\n                              extraTextFormatInfo:extraTextFormatInfo";
  if (text_format_decode_data.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      text_format_decode_data.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_580 = "";
  }
  io::Printer::Sub::Sub<char_const*>(&local_258,&local_578,&local_580);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"enum_flags",&local_69e);
  bVar2 = EnumDescriptor::is_closed(local_678->descriptor_);
  local_5a8 = "GPBEnumDescriptorInitializationFlag_None";
  if (bVar2) {
    local_5a8 = "GPBEnumDescriptorInitializationFlag_IsClosed";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1a0,&local_5a0,&local_5a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"enum_cases",&local_69f);
  local_e8 = local_d8;
  if (local_650 == local_640) {
    uStack_d0 = uStack_638;
  }
  else {
    local_e8 = local_650;
  }
  local_e0 = local_648;
  local_648 = 0;
  local_640[0] = 0;
  local_688 = (code *)0x0;
  pcStack_680 = (code *)0x0;
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_650 = local_640;
  local_698._M_unused._M_object = operator_new(0x18);
  *(EnumGenerator **)local_698._M_unused._0_8_ = local_678;
  *(Printer ***)((long)local_698._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_698._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_680 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_698);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(pPVar1,&short_name,7,0x5b7,
                    "\n        #pragma mark - Enum $name$\n\n        GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n          static _Atomic(GPBEnumDescriptor*) descriptor = nil;\n          if (!descriptor) {\n            static const char *valueNames =\n                $values_name_blob$\n            static const int32_t values[] = {\n                $values$\n            };\n            $maybe_extra_text_format_decl$\n            GPBEnumDescriptor *worker =\n                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                           runtimeSupport:&$google_protobuf_runtime_support$\n                                               valueNames:valueNames\n                                                   values:values\n                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                             enumVerifier:$name$_IsValidValue\n                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];\n            GPBEnumDescriptor *expected = nil;\n            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {\n              [worker release];\n            }\n          }\n          return descriptor;\n        }\n\n        BOOL $name$_IsValidValue(int32_t value__) {\n          switch (value__) {\n            $enum_cases$\n              return YES;\n            default:\n              return NO;\n          }\n        }\n      "
                   );
  lVar4 = 0x450;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&short_name._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != -0xb8);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_558);
  io::Printer::Emit(printer_local,1,"\n");
  std::__cxx11::string::~string((string *)&text_blob);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&text_format_decode_data.entries_);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) const {
  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  std::string text_blob;

  for (const auto* v : all_values_) {
    ++enum_value_description_key;
    std::string short_name(EnumValueShortName(v));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != v->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        v->name());
    }
  }

  printer->Emit(
      {{"name", name_},
       {"values_name_blob",
        [&] {
          static const int kBytesPerLine = 40;  // allow for escaping
          for (size_t i = 0; i < text_blob.size(); i += kBytesPerLine) {
            printer->Emit({{"data", EscapeTrigraphs(absl::CEscape(
                                        text_blob.substr(i, kBytesPerLine)))},
                           {"ending_semi",
                            (i + kBytesPerLine) < text_blob.size() ? "" : ";"}},
                          R"objc(
                            "$data$"$ending_semi$
                          )objc");
          }
        }},
       {"values",
        [&] {
          for (const auto* v : all_values_) {
            printer->Emit({{"value_name", EnumValueName(v)}},
                          R"objc(
                            $value_name$,
                          )objc");
          }
        }},
       {"maybe_extra_text_format_decl",
        [&] {
          if (text_format_decode_data.num_entries()) {
            printer->Emit({{"extraTextFormatInfo",
                            absl::CEscape(text_format_decode_data.Data())}},
                          R"objc(
                            static const char *extraTextFormatInfo = "$extraTextFormatInfo$";
                          )objc");
          }
        }},
       {"maybe_extraTextFormatInfo",
        // Could not find a better way to get this extra line inserted and
        // correctly formatted.
        (text_format_decode_data.num_entries() == 0
             ? ""
             : "\n                              "
               "extraTextFormatInfo:extraTextFormatInfo")},
       {"enum_flags", descriptor_->is_closed()
                          ? "GPBEnumDescriptorInitializationFlag_IsClosed"
                          : "GPBEnumDescriptorInitializationFlag_None"},
       {"enum_cases",
        [&] {
          for (const auto* v : base_values_) {
            printer->Emit({{"case_name", EnumValueName(v)}},
                          R"objc(
                            case $case_name$:
                          )objc");
          }
        }}},
      R"objc(
        #pragma mark - Enum $name$

        GPBEnumDescriptor *$name$_EnumDescriptor(void) {
          static _Atomic(GPBEnumDescriptor*) descriptor = nil;
          if (!descriptor) {
            static const char *valueNames =
                $values_name_blob$
            static const int32_t values[] = {
                $values$
            };
            $maybe_extra_text_format_decl$
            GPBEnumDescriptor *worker =
                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)
                                           runtimeSupport:&$google_protobuf_runtime_support$
                                               valueNames:valueNames
                                                   values:values
                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))
                                             enumVerifier:$name$_IsValidValue
                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];
            GPBEnumDescriptor *expected = nil;
            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {
              [worker release];
            }
          }
          return descriptor;
        }

        BOOL $name$_IsValidValue(int32_t value__) {
          switch (value__) {
            $enum_cases$
              return YES;
            default:
              return NO;
          }
        }
      )objc");
  printer->Emit("\n");
}